

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

uint fmt::internal::parse_nonnegative_int<char>(char **s)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  FormatError *this;
  char *pcVar4;
  
  uVar2 = 0;
  pcVar1 = *s;
  do {
    pcVar4 = pcVar1 + 1;
    *s = pcVar4;
    uVar3 = (uVar2 * 10 + (int)*pcVar1) - 0x30;
    if (uVar3 < uVar2) goto LAB_00128383;
    uVar2 = uVar3;
    pcVar1 = pcVar4;
  } while ((byte)(*pcVar4 - 0x30U) < 10);
  if (-1 < (int)uVar3) {
    return uVar3;
  }
LAB_00128383:
  this = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this,(CStringRef)0x13581b);
  __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

unsigned parse_nonnegative_int(const Char *&s) {
  assert('0' <= *s && *s <= '9');
  unsigned value = 0;
  do {
    unsigned new_value = value * 10 + (*s++ - '0');
    // Check if value wrapped around.
    if (new_value < value) {
      value = (std::numeric_limits<unsigned>::max)();
      break;
    }
    value = new_value;
  } while ('0' <= *s && *s <= '9');
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  if (value > max_int)
    FMT_THROW(FormatError("number is too big"));
  return value;
}